

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_context.c
# Opt level: O3

GLFWbool chooseGLXFBConfig(_GLFWfbconfig *desired,GLXFBConfig *result)

{
  GLXFBConfig p_Var1;
  int iVar2;
  char *__s1;
  GLXFBConfig *pp_Var3;
  _GLFWfbconfig *p_Var4;
  uint uVar5;
  long lVar6;
  int value;
  int nativeCount;
  uint local_5c;
  _GLFWfbconfig *local_58;
  uint local_4c;
  int local_48;
  int local_44;
  GLXFBConfig *local_40;
  _GLFWfbconfig *local_38;
  
  __s1 = (*_glfw.glx.GetClientString)(_glfw.x11.display,1);
  local_48 = strcmp(__s1,"Chromium");
  pp_Var3 = (*_glfw.glx.GetFBConfigs)(_glfw.x11.display,_glfw.x11.screen,&local_44);
  iVar2 = local_44;
  if ((long)local_44 == 0) {
    uVar5 = 0;
    _glfwInputError(0x10006,"GLX: No GLXFBConfigs returned");
  }
  else {
    local_40 = result;
    local_38 = desired;
    local_58 = (_GLFWfbconfig *)calloc((long)local_44,0x48);
    if (iVar2 < 1) {
      uVar5 = 0;
    }
    else {
      lVar6 = 0;
      uVar5 = 0;
      do {
        p_Var1 = pp_Var3[lVar6];
        (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,0x8011,(int *)&local_5c);
        if (((local_5c & 1) != 0) &&
           (((*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,0x8010,(int *)&local_5c),
            local_48 == 0 || ((local_5c & 1) != 0)))) {
          p_Var4 = local_58 + (int)uVar5;
          local_4c = uVar5;
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,8,(int *)&local_5c);
          p_Var4->redBits = local_5c;
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,9,(int *)&local_5c);
          p_Var4->greenBits = local_5c;
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,10,(int *)&local_5c);
          p_Var4->blueBits = local_5c;
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,0xb,(int *)&local_5c);
          p_Var4->alphaBits = local_5c;
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,0xc,(int *)&local_5c);
          p_Var4->depthBits = local_5c;
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,0xd,(int *)&local_5c);
          p_Var4->stencilBits = local_5c;
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,0xe,(int *)&local_5c);
          p_Var4->accumRedBits = local_5c;
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,0xf,(int *)&local_5c);
          p_Var4->accumGreenBits = local_5c;
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,0x10,(int *)&local_5c);
          p_Var4->accumBlueBits = local_5c;
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,0x11,(int *)&local_5c);
          p_Var4->accumAlphaBits = local_5c;
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,7,(int *)&local_5c);
          p_Var4->auxBuffers = local_5c;
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,6,(int *)&local_5c);
          if (local_5c != 0) {
            p_Var4->stereo = 1;
          }
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,5,(int *)&local_5c);
          if (local_5c != 0) {
            p_Var4->doublebuffer = 1;
          }
          if (_glfw.glx.ARB_multisample != 0) {
            (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,0x186a1,(int *)&local_5c);
            p_Var4->samples = local_5c;
          }
          if (_glfw.glx.EXT_framebuffer_sRGB != 0 || _glfw.glx.ARB_framebuffer_sRGB != 0) {
            (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,0x20b2,(int *)&local_5c);
            p_Var4->sRGB = local_5c;
          }
          p_Var4->handle = (uintptr_t)p_Var1;
          uVar5 = local_4c + 1;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < local_44);
    }
    p_Var4 = _glfwChooseFBConfig(local_38,local_58,uVar5);
    if (p_Var4 != (_GLFWfbconfig *)0x0) {
      *local_40 = (GLXFBConfig)p_Var4->handle;
    }
    uVar5 = (uint)(p_Var4 != (_GLFWfbconfig *)0x0);
    XFree(pp_Var3);
    free(local_58);
  }
  return uVar5;
}

Assistant:

static GLFWbool chooseGLXFBConfig(const _GLFWfbconfig* desired, GLXFBConfig* result)
{
    GLXFBConfig* nativeConfigs;
    _GLFWfbconfig* usableConfigs;
    const _GLFWfbconfig* closest;
    int i, nativeCount, usableCount;
    const char* vendor;
    GLFWbool trustWindowBit = GLFW_TRUE;

    // HACK: This is a (hopefully temporary) workaround for Chromium
    //       (VirtualBox GL) not setting the window bit on any GLXFBConfigs
    vendor = glXGetClientString(_glfw.x11.display, GLX_VENDOR);
    if (strcmp(vendor, "Chromium") == 0)
        trustWindowBit = GLFW_FALSE;

    nativeConfigs =
        glXGetFBConfigs(_glfw.x11.display, _glfw.x11.screen, &nativeCount);
    if (!nativeCount)
    {
        _glfwInputError(GLFW_API_UNAVAILABLE, "GLX: No GLXFBConfigs returned");
        return GLFW_FALSE;
    }

    usableConfigs = calloc(nativeCount, sizeof(_GLFWfbconfig));
    usableCount = 0;

    for (i = 0;  i < nativeCount;  i++)
    {
        const GLXFBConfig n = nativeConfigs[i];
        _GLFWfbconfig* u = usableConfigs + usableCount;

        // Only consider RGBA GLXFBConfigs
        if (!(getGLXFBConfigAttrib(n, GLX_RENDER_TYPE) & GLX_RGBA_BIT))
            continue;

        // Only consider window GLXFBConfigs
        if (!(getGLXFBConfigAttrib(n, GLX_DRAWABLE_TYPE) & GLX_WINDOW_BIT))
        {
            if (trustWindowBit)
                continue;
        }

        u->redBits = getGLXFBConfigAttrib(n, GLX_RED_SIZE);
        u->greenBits = getGLXFBConfigAttrib(n, GLX_GREEN_SIZE);
        u->blueBits = getGLXFBConfigAttrib(n, GLX_BLUE_SIZE);

        u->alphaBits = getGLXFBConfigAttrib(n, GLX_ALPHA_SIZE);
        u->depthBits = getGLXFBConfigAttrib(n, GLX_DEPTH_SIZE);
        u->stencilBits = getGLXFBConfigAttrib(n, GLX_STENCIL_SIZE);

        u->accumRedBits = getGLXFBConfigAttrib(n, GLX_ACCUM_RED_SIZE);
        u->accumGreenBits = getGLXFBConfigAttrib(n, GLX_ACCUM_GREEN_SIZE);
        u->accumBlueBits = getGLXFBConfigAttrib(n, GLX_ACCUM_BLUE_SIZE);
        u->accumAlphaBits = getGLXFBConfigAttrib(n, GLX_ACCUM_ALPHA_SIZE);

        u->auxBuffers = getGLXFBConfigAttrib(n, GLX_AUX_BUFFERS);

        if (getGLXFBConfigAttrib(n, GLX_STEREO))
            u->stereo = GLFW_TRUE;
        if (getGLXFBConfigAttrib(n, GLX_DOUBLEBUFFER))
            u->doublebuffer = GLFW_TRUE;

        if (_glfw.glx.ARB_multisample)
            u->samples = getGLXFBConfigAttrib(n, GLX_SAMPLES);

        if (_glfw.glx.ARB_framebuffer_sRGB || _glfw.glx.EXT_framebuffer_sRGB)
            u->sRGB = getGLXFBConfigAttrib(n, GLX_FRAMEBUFFER_SRGB_CAPABLE_ARB);

        u->handle = (uintptr_t) n;
        usableCount++;
    }

    closest = _glfwChooseFBConfig(desired, usableConfigs, usableCount);
    if (closest)
        *result = (GLXFBConfig) closest->handle;

    XFree(nativeConfigs);
    free(usableConfigs);

    return closest != NULL;
}